

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int parse_match_net(vec *vec,usa *sa,int no_strict)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ushort **ppuVar8;
  char cVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  byte *pbVar15;
  int *piVar16;
  int n;
  uint slash;
  uint c;
  uint d;
  uint b;
  uint a;
  char ad [50];
  sockaddr_in6 sin6;
  
  piVar16 = &n;
  iVar5 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u/%u%n",&a,&b,&c,&d,&slash,&n);
  if (iVar5 != 5) {
    slash = 0x20;
    iVar5 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u%n",&a,&b,&c,&d,&n,piVar16);
    if (iVar5 != 4) {
      n = 0;
      goto LAB_00120844;
    }
  }
  if ((0 < (long)n) && (vec->len == (long)n)) {
    if (0x20 < slash || ((0xff < d || 0xff < c) || (0xff < b || 0xff < a))) {
      return -1;
    }
    if ((sa->sa).sa_family == 2) {
      uVar6 = (sa->sin6).sin6_flowinfo;
      uVar13 = -1 << (-(char)slash & 0x1fU);
      if (slash == 0) {
        uVar13 = 0;
      }
      return (uint)((uVar13 & (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18)) == (c << 8 | d | b << 0x10 | a << 0x18));
    }
    return 0;
  }
LAB_00120844:
  pbVar15 = (byte *)ad;
  iVar5 = __isoc99_sscanf(vec->ptr,"[%49[^]]]/%u%n",pbVar15,&slash);
  if (iVar5 != 2) {
    slash = 0x80;
    iVar5 = __isoc99_sscanf(vec->ptr,"[%49[^]]]%n",ad,&n);
    if (iVar5 != 1) {
      n = 0;
    }
  }
  uVar6 = n;
  if (no_strict != 0 && n < 1) {
    pcVar10 = vec->ptr;
    pcVar7 = strchr(pcVar10,0x2f);
    uVar11 = vec->len;
    if (pcVar7 < pcVar10 + uVar11 && pcVar7 != (char *)0x0) {
      if (0x31 < (ulong)((long)pcVar7 - (long)pcVar10)) {
        return -1;
      }
      iVar5 = __isoc99_sscanf(pcVar7,"/%u%n",&slash,&n);
      if (iVar5 != 1) {
        return -1;
      }
      pcVar10 = vec->ptr;
      uVar14 = (long)pcVar7 - (long)pcVar10;
      n = n + (int)uVar14;
      uVar11 = (ulong)(uint)n;
      cVar9 = *pcVar10;
      pcVar7 = ad;
      if (cVar9 != '\0') {
        uVar4 = uVar14 + 1;
        while (uVar3 = uVar14, 1 < uVar4) {
          pcVar10 = pcVar10 + 1;
          *pcVar7 = cVar9;
          pcVar7 = pcVar7 + 1;
          cVar9 = *pcVar10;
          if (cVar9 == '\0') break;
          uVar14 = uVar3 - 1;
          uVar4 = uVar3;
        }
      }
    }
    else {
      if (0x31 < uVar11) {
        return -1;
      }
      n = (int)uVar11;
      slash = 0x80;
      cVar9 = *pcVar10;
      if (uVar11 == 0 || cVar9 == '\0') {
        pcVar7 = ad;
      }
      else {
        pcVar7 = ad;
        uVar14 = uVar11;
        do {
          pcVar10 = pcVar10 + 1;
          *pcVar7 = cVar9;
          pcVar7 = pcVar7 + 1;
          cVar9 = *pcVar10;
          if (cVar9 == '\0') break;
          bVar2 = 1 < uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar2);
      }
    }
    uVar6 = (uint)uVar11;
    *pcVar7 = '\0';
  }
  if (((0 < (int)uVar6) && (vec->len == (ulong)uVar6)) && (slash < 0x81)) {
    c = 0;
    ppuVar8 = __ctype_b_loc();
    uVar6 = 0;
    while (((bVar1 = *pbVar15, ((*ppuVar8)[bVar1] >> 0xc & 1) != 0 || (bVar1 == 0x3a)) ||
           (bVar1 == 0x2e))) {
      pbVar15 = pbVar15 + 1;
      if (bVar1 == 0x3a) {
        uVar6 = uVar6 + 1;
        c = uVar6;
      }
    }
    if (1 < uVar6 && bVar1 == 0) {
      if ((sa->sa).sa_family == 10) {
        iVar5 = mg_inet_pton(10,ad,&sin6,0x1c,0);
        if (iVar5 == 0) {
          return -1;
        }
        uVar11 = 8;
        lVar12 = 0;
        while( true ) {
          uVar6 = 0xff;
          if ((slash <= uVar11) && (uVar6 = 0, uVar11 - 8 < (ulong)slash)) {
            uVar6 = 0xff << ((char)uVar11 - (char)slash & 0x1fU);
          }
          if ((*(byte *)((long)sa + lVar12 + 8) & uVar6) !=
              (uint)sin6.sin6_addr.__in6_u.__u6_addr8[lVar12]) break;
          lVar12 = lVar12 + 1;
          uVar11 = uVar11 + 8;
          if (lVar12 == 0x10) {
            return 1;
          }
        }
      }
      return 0;
    }
  }
  return -1;
}

Assistant:

static int
parse_match_net(const struct vec *vec, const union usa *sa, int no_strict)
{
	int n;
	unsigned int a, b, c, d, slash;

	if (sscanf(vec->ptr, "%u.%u.%u.%u/%u%n", &a, &b, &c, &d, &slash, &n)
	    != 5) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to an
		        // integer value, but function will not report conversion
		        // errors; consider using 'strtol' instead
		slash = 32;
		if (sscanf(vec->ptr, "%u.%u.%u.%u%n", &a, &b, &c, &d, &n)
		    != 4) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to
			        // an integer value, but function will not report conversion
			        // errors; consider using 'strtol' instead
			n = 0;
		}
	}

	if ((n > 0) && ((size_t)n == vec->len)) {
		if ((a < 256) && (b < 256) && (c < 256) && (d < 256) && (slash < 33)) {
			/* IPv4 format */
			if (sa->sa.sa_family == AF_INET) {
				uint32_t ip = ntohl(sa->sin.sin_addr.s_addr);
				uint32_t net = ((uint32_t)a << 24) | ((uint32_t)b << 16)
				               | ((uint32_t)c << 8) | (uint32_t)d;
				uint32_t mask = slash ? (0xFFFFFFFFu << (32 - slash)) : 0;
				return (ip & mask) == net;
			}
			return 0;
		}
	}
#if defined(USE_IPV6)
	else {
		char ad[50];
		const char *p;

		if (sscanf(vec->ptr, "[%49[^]]]/%u%n", ad, &slash, &n) != 2) {
			slash = 128;
			if (sscanf(vec->ptr, "[%49[^]]]%n", ad, &n) != 1) {
				n = 0;
			}
		}

		if ((n <= 0) && no_strict) {
			/* no square brackets? */
			p = strchr(vec->ptr, '/');
			if (p && (p < (vec->ptr + vec->len))) {
				if (((size_t)(p - vec->ptr) < sizeof(ad))
				    && (sscanf(p, "/%u%n", &slash, &n) == 1)) {
					n += (int)(p - vec->ptr);
					mg_strlcpy(ad, vec->ptr, (size_t)(p - vec->ptr) + 1);
				} else {
					n = 0;
				}
			} else if (vec->len < sizeof(ad)) {
				n = (int)vec->len;
				slash = 128;
				mg_strlcpy(ad, vec->ptr, vec->len + 1);
			}
		}

		if ((n > 0) && ((size_t)n == vec->len) && (slash < 129)) {
			p = ad;
			c = 0;
			/* zone indexes are unsupported, at least two colons are needed */
			while (isxdigit((unsigned char)*p) || (*p == '.') || (*p == ':')) {
				if (*(p++) == ':') {
					c++;
				}
			}
			if ((*p == '\0') && (c >= 2)) {
				struct sockaddr_in6 sin6;
				unsigned int i;

				/* for strict validation, an actual IPv6 argument is needed */
				if (sa->sa.sa_family != AF_INET6) {
					return 0;
				}
				if (mg_inet_pton(AF_INET6, ad, &sin6, sizeof(sin6), 0)) {
					/* IPv6 format */
					for (i = 0; i < 16; i++) {
						uint8_t ip = sa->sin6.sin6_addr.s6_addr[i];
						uint8_t net = sin6.sin6_addr.s6_addr[i];
						uint8_t mask = 0;

						if (8 * i + 8 < slash) {
							mask = 0xFFu;
						} else if (8 * i < slash) {
							mask = (uint8_t)(0xFFu << (8 * i + 8 - slash));
						}
						if ((ip & mask) != net) {
							return 0;
						}
					}
					return 1;
				}
			}
		}
	}
#else
	(void)no_strict;
#endif

	/* malformed */
	return -1;
}